

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O3

void __thiscall cmCMakePath::cmCMakePath(cmCMakePath *this,string_view source,format fmt)

{
  string_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,source._M_str,source._M_str + source._M_len);
  if (local_38 == &local_28) {
    local_58.field_2._8_8_ = local_28._8_8_;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58._M_dataplus._M_p = (pointer)local_38;
  }
  local_58.field_2._M_allocated_capacity = local_28._M_allocated_capacity;
  local_58._M_string_length = local_30;
  std::filesystem::__cxx11::path::path(&this->Path,&local_58,auto_format);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmCMakePath(cm::string_view source, format fmt = generic_format) noexcept
    : Path(FormatPath(source, fmt))
  {
  }